

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.cpp
# Opt level: O3

int is_prime(int x)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  uVar2 = 0xffffffff;
  if (((1 < x) && (uVar2 = 1, 3 < (uint)x)) && (uVar2 = 0, (x & 1U) != 0)) {
    dVar3 = floor(SQRT((double)x));
    uVar2 = 1;
    if (3.0 <= dVar3) {
      iVar1 = 5;
      do {
        uVar2 = (uint)x % (iVar1 - 2U);
        if (uVar2 == 0) break;
        dVar4 = (double)iVar1;
        iVar1 = iVar1 + 2;
      } while (dVar4 <= dVar3);
      uVar2 = (uint)(uVar2 != 0);
    }
  }
  return uVar2;
}

Assistant:

int is_prime(const int x) {
    if (x < 2) {
        return -1;
    }

    if (x < 4) {
        return 1;
    }

    if (x % 2 == 0) {
        return 0;
    }

    for (int i = 3; i <= floor(sqrt((double) x)); i += 2) {
        if ((x % i) == 0) {
            return 0;
        }
    }

    return 1;
}